

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O0

bool duckdb::ExtractAll(StringPiece *input,RE2 *pattern,idx_t *startpos,StringPiece *groups,
                       int ngroups)

{
  long lVar1;
  bool bVar2;
  const_iterator pcVar3;
  const_iterator pcVar4;
  size_type sVar5;
  const_reference pcVar6;
  StringPiece *in_RCX;
  long *in_RDX;
  StringPiece *in_RDI;
  idx_t consumed;
  StringPiece *in_stack_000013d0;
  Anchor in_stack_000013dc;
  size_t in_stack_000013e0;
  size_t in_stack_000013e8;
  StringPiece *in_stack_000013f0;
  RE2 *in_stack_000013f8;
  int in_stack_00001410;
  byte local_59;
  long local_38;
  bool local_1;
  
  duckdb_re2::StringPiece::size(in_RDI);
  bVar2 = duckdb_re2::RE2::Match
                    (in_stack_000013f8,in_stack_000013f0,in_stack_000013e8,in_stack_000013e0,
                     in_stack_000013dc,in_stack_000013d0,in_stack_00001410);
  if (bVar2) {
    pcVar3 = duckdb_re2::StringPiece::end(in_RCX);
    pcVar4 = duckdb_re2::StringPiece::begin(in_RDI);
    local_38 = (long)pcVar3 - (long)(pcVar4 + *in_RDX);
    if (local_38 == 0) {
      local_38 = 0;
      do {
        local_38 = local_38 + 1;
        lVar1 = *in_RDX;
        sVar5 = duckdb_re2::StringPiece::length(in_RDI);
        local_59 = 0;
        if ((ulong)(lVar1 + local_38) < sVar5) {
          pcVar6 = duckdb_re2::StringPiece::operator[](in_RDI,*in_RDX + local_38);
          bVar2 = IsCharacter(*pcVar6);
          local_59 = bVar2 ^ 0xff;
        }
      } while ((local_59 & 1) != 0);
    }
    *in_RDX = local_38 + *in_RDX;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ExtractAll(duckdb_re2::StringPiece &input, duckdb_re2::RE2 &pattern, idx_t *startpos,
                duckdb_re2::StringPiece *groups, int ngroups) {

	D_ASSERT(pattern.ok());
	D_ASSERT(pattern.NumberOfCapturingGroups() == ngroups);

	if (!pattern.Match(input, *startpos, input.size(), pattern.UNANCHORED, groups, ngroups + 1)) {
		return false;
	}
	idx_t consumed = static_cast<size_t>(groups[0].end() - (input.begin() + *startpos));
	if (!consumed) {
		// Empty match found, have to manually forward the input
		// to avoid an infinite loop
		// FIXME: support unicode characters
		consumed++;
		while (*startpos + consumed < input.length() && !IsCharacter(input[*startpos + consumed])) {
			consumed++;
		}
	}
	*startpos += consumed;
	return true;
}